

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::MergeFrom
          (BayesianProbitRegressor_FeatureValueWeight *this,
          BayesianProbitRegressor_FeatureValueWeight *from)

{
  bool bVar1;
  uint32_t uVar2;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *this_00;
  BayesianProbitRegressor_Gaussian *from_00;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  BayesianProbitRegressor_FeatureValueWeight *local_18;
  BayesianProbitRegressor_FeatureValueWeight *from_local;
  BayesianProbitRegressor_FeatureValueWeight *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x1f5);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = _internal_has_featureweight(local_18);
  if (bVar1) {
    this_00 = _internal_mutable_featureweight(this);
    from_00 = _internal_featureweight(local_18);
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,from_00);
  }
  uVar2 = _internal_featurevalue(local_18);
  if (uVar2 != 0) {
    uVar2 = _internal_featurevalue(local_18);
    _internal_set_featurevalue(this,uVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::MergeFrom(const BayesianProbitRegressor_FeatureValueWeight& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_featureweight()) {
    _internal_mutable_featureweight()->::CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom(from._internal_featureweight());
  }
  if (from._internal_featurevalue() != 0) {
    _internal_set_featurevalue(from._internal_featurevalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}